

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O2

int mbedtls_oid_from_numeric_string(mbedtls_asn1_buf *oid,char *oid_str,size_t size)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uchar *puVar4;
  uchar *__dest;
  size_t i;
  size_t sVar5;
  uint uVar6;
  char *bound;
  size_t __nmemb;
  uint local_58;
  uint local_54;
  uint component1;
  uint component2;
  uchar *out_ptr;
  int iStack_40;
  uint val;
  char *local_38;
  char *str_ptr;
  
  out_ptr._4_4_ = 0;
  lVar3 = 0;
  for (sVar5 = 0; size != sVar5; sVar5 = sVar5 + 1) {
    lVar3 = lVar3 + (ulong)(oid_str[sVar5] == '.');
  }
  if (lVar3 - 0x80U < 0xffffffffffffff81) {
    return -0x68;
  }
  local_38 = oid_str;
  puVar4 = (uchar *)calloc(lVar3 * 5,1);
  oid->p = puVar4;
  if (puVar4 == (uchar *)0x0) {
    return -0x6a;
  }
  bound = oid_str + size;
  _component1 = puVar4;
  iVar2 = oid_parse_number(&local_58,&local_38,bound);
  if ((((iVar2 == 0) && (iVar1 = -0x68, iVar2 = iVar1, local_58 < 3)) && (local_38 < bound)) &&
     (*local_38 == '.')) {
    _iStack_40 = (char *)CONCAT44(val,local_58);
    local_38 = local_38 + 1;
    iVar2 = oid_parse_number(&local_54,&local_38,bound);
    if ((iVar2 == 0) && (iVar2 = iVar1, iStack_40 == 2 || local_54 < 0x28)) {
      if (local_38 < bound) {
        if (*local_38 != '.') goto LAB_001e6b50;
        local_38 = local_38 + 1;
      }
      uVar6 = iStack_40 * 0x28;
      if (!CARRY4(uVar6,local_54)) {
        _iStack_40 = local_38;
        iVar2 = oid_subidentifier_encode_into
                          ((uchar **)&component1,puVar4 + lVar3 * 5,uVar6 + local_54);
        if (iVar2 == 0) {
          do {
            if (bound <= _iStack_40) {
              puVar4 = oid->p;
              __nmemb = (long)_component1 - (long)puVar4;
              __dest = (uchar *)calloc(__nmemb,1);
              if (__dest != (uchar *)0x0) {
                memcpy(__dest,puVar4,__nmemb);
                free(puVar4);
                oid->p = __dest;
                oid->len = __nmemb;
                oid->tag = 6;
                return 0;
              }
              iVar2 = -0x6a;
              break;
            }
            iVar2 = oid_parse_number((uint *)((long)&out_ptr + 4),&local_38,bound);
            if (iVar2 != 0) break;
            if (local_38 < bound) {
              if (*local_38 != '.') {
                iVar2 = -0x68;
                break;
              }
              local_38 = local_38 + 1;
            }
            _iStack_40 = local_38;
            iVar2 = oid_subidentifier_encode_into
                              ((uchar **)&component1,puVar4 + lVar3 * 5,out_ptr._4_4_);
          } while (iVar2 == 0);
        }
      }
    }
  }
LAB_001e6b50:
  free(oid->p);
  oid->len = 0;
  oid->p = (uchar *)0x0;
  return iVar2;
}

Assistant:

int mbedtls_oid_from_numeric_string(mbedtls_asn1_buf *oid,
                                    const char *oid_str, size_t size)
{
    int ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
    const char *str_ptr = oid_str;
    const char *str_bound = oid_str + size;
    unsigned int val = 0;
    unsigned int component1, component2;
    size_t encoded_len;
    unsigned char *resized_mem;

    /* Count the number of dots to get a worst-case allocation size. */
    size_t num_dots = 0;
    for (size_t i = 0; i < size; i++) {
        if (oid_str[i] == '.') {
            num_dots++;
        }
    }
    /* Allocate maximum possible required memory:
     * There are (num_dots + 1) integer components, but the first 2 share the
     * same subidentifier, so we only need num_dots subidentifiers maximum. */
    if (num_dots == 0 || (num_dots > MBEDTLS_OID_MAX_COMPONENTS - 1)) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }
    /* Each byte can store 7 bits, calculate number of bytes for a
     * subidentifier:
     *
     * bytes = ceil(subidentifer_size * 8 / 7)
     */
    size_t bytes_per_subidentifier = (((sizeof(unsigned int) * 8) - 1) / 7)
                                     + 1;
    size_t max_possible_bytes = num_dots * bytes_per_subidentifier;
    oid->p = mbedtls_calloc(max_possible_bytes, 1);
    if (oid->p == NULL) {
        return MBEDTLS_ERR_ASN1_ALLOC_FAILED;
    }
    unsigned char *out_ptr = oid->p;
    unsigned char *out_bound = oid->p + max_possible_bytes;

    ret = oid_parse_number(&component1, &str_ptr, str_bound);
    if (ret != 0) {
        goto error;
    }
    if (component1 > 2) {
        /* First component can't be > 2 */
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    if (str_ptr >= str_bound || *str_ptr != '.') {
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    str_ptr++;

    ret = oid_parse_number(&component2, &str_ptr, str_bound);
    if (ret != 0) {
        goto error;
    }
    if ((component1 < 2) && (component2 > 39)) {
        /* Root nodes 0 and 1 may have up to 40 children, numbered 0-39 */
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    if (str_ptr < str_bound) {
        if (*str_ptr == '.') {
            str_ptr++;
        } else {
            ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
            goto error;
        }
    }

    if (component2 > (UINT_MAX - (component1 * 40))) {
        ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
        goto error;
    }
    ret = oid_subidentifier_encode_into(&out_ptr, out_bound,
                                        (component1 * 40) + component2);
    if (ret != 0) {
        goto error;
    }

    while (str_ptr < str_bound) {
        ret = oid_parse_number(&val, &str_ptr, str_bound);
        if (ret != 0) {
            goto error;
        }
        if (str_ptr < str_bound) {
            if (*str_ptr == '.') {
                str_ptr++;
            } else {
                ret = MBEDTLS_ERR_ASN1_INVALID_DATA;
                goto error;
            }
        }

        ret = oid_subidentifier_encode_into(&out_ptr, out_bound, val);
        if (ret != 0) {
            goto error;
        }
    }

    encoded_len = out_ptr - oid->p;
    resized_mem = mbedtls_calloc(encoded_len, 1);
    if (resized_mem == NULL) {
        ret = MBEDTLS_ERR_ASN1_ALLOC_FAILED;
        goto error;
    }
    memcpy(resized_mem, oid->p, encoded_len);
    mbedtls_free(oid->p);
    oid->p = resized_mem;
    oid->len = encoded_len;

    oid->tag = MBEDTLS_ASN1_OID;

    return 0;

error:
    mbedtls_free(oid->p);
    oid->p = NULL;
    oid->len = 0;
    return ret;
}